

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.h
# Opt level: O0

VariableIndex __thiscall
cnn::ComputationGraph::add_function<cnn::Pow>
          (ComputationGraph *this,initializer_list<cnn::VariableIndex> *arguments)

{
  size_type sVar1;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *in_RSI;
  Pow *in_RDI;
  VariableIndex *in_stack_00000048;
  VariableIndex *new_node_index;
  initializer_list<cnn::VariableIndex> *in_stack_ffffffffffffff98;
  uint uVar2;
  Pow *this_00;
  uint local_1c [7];
  
  this_00 = in_RDI;
  sVar1 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size(in_RSI);
  local_1c[0] = (uint)sVar1;
  VariableIndex::VariableIndex((VariableIndex *)in_RDI,local_1c);
  operator_new(0x50);
  Pow::Pow(this_00,in_stack_ffffffffffffff98);
  std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::push_back
            ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)this_00,
             (value_type *)in_stack_ffffffffffffff98);
  uVar2 = (uint)this_00;
  set_dim_for_new_node((ComputationGraph *)arguments,in_stack_00000048);
  return (VariableIndex)uVar2;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}